

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

int start_page(vorb *f)

{
  uint8 uVar1;
  int iVar2;
  
  uVar1 = get8(f);
  if (uVar1 == 'O') {
    uVar1 = get8(f);
    if (uVar1 == 'g') {
      uVar1 = get8(f);
      if (uVar1 == 'g') {
        uVar1 = get8(f);
        if (uVar1 == 'S') {
          iVar2 = start_page_no_capturepattern(f);
          return iVar2;
        }
      }
    }
  }
  f->error = VORBIS_missing_capture_pattern;
  return 0;
}

Assistant:

static int start_page(vorb *f)
{
   if (!capture_pattern(f)) return error(f, VORBIS_missing_capture_pattern);
   return start_page_no_capturepattern(f);
}